

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

vector<duckdb::SimilarCatalogEntry,_true> *
duckdb::Catalog::SimilarEntriesInSchemas
          (ClientContext *context,EntryLookupInfo *lookup_info,
          reference_set_t<SchemaCatalogEntry> *schemas)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 uVar6;
  reference pvVar7;
  reference pvVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  vector<duckdb::SimilarCatalogEntry,_true> *in_RDI;
  SimilarCatalogEntry entry;
  CatalogTransaction transaction;
  SchemaCatalogEntry *schema;
  value_type schema_ref;
  const_iterator __end1;
  const_iterator __begin1;
  reference_set_t<SchemaCatalogEntry> *__range1;
  vector<duckdb::SimilarCatalogEntry,_true> *results;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined7 in_stack_fffffffffffffef0;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_b8 [32];
  double local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  SchemaCatalogEntry *local_50;
  reference_wrapper<duckdb::SchemaCatalogEntry> local_48;
  _Node_iterator_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_40;
  _Node_iterator_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_38;
  undefined8 local_30;
  undefined1 local_21;
  undefined8 local_20;
  undefined8 local_18;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  vector<duckdb::SimilarCatalogEntry,_true>::vector
            ((vector<duckdb::SimilarCatalogEntry,_true> *)0x29b051);
  local_30 = local_20;
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ::begin((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_40._M_cur =
       (__node_type *)
       ::std::
       unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ::end((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  while (bVar5 = ::std::__detail::operator!=(&local_38,&local_40), bVar5) {
    pvVar7 = ::std::__detail::
             _Node_const_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>::
             operator*((_Node_const_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>
                        *)0x29b0b6);
    local_48._M_data = pvVar7->_M_data;
    local_50 = ::std::reference_wrapper<duckdb::SchemaCatalogEntry>::get(&local_48);
    GetCatalogTransaction
              ((Catalog *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (ClientContext *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    local_c8 = local_58;
    local_d8 = local_68;
    uVar3 = local_d8;
    uStack_d0 = uStack_60;
    uVar4 = uStack_d0;
    local_e8 = local_78;
    uVar1 = local_e8;
    uStack_e0 = uStack_70;
    uVar2 = uStack_e0;
    local_e8._0_4_ = (undefined4)local_78;
    local_e8._4_4_ = (undefined4)((ulong)local_78 >> 0x20);
    uStack_e0._0_4_ = (undefined4)uStack_70;
    uStack_e0._4_4_ = (undefined4)((ulong)uStack_70 >> 0x20);
    local_d8._0_4_ = (undefined4)local_68;
    local_d8._4_4_ = (undefined4)((ulong)local_68 >> 0x20);
    uStack_d0._0_4_ = (undefined4)uStack_60;
    uStack_d0._4_4_ = (undefined4)((ulong)uStack_60 >> 0x20);
    in_stack_fffffffffffffea8 = (undefined4)local_e8;
    in_stack_fffffffffffffeac = local_e8._4_4_;
    in_stack_fffffffffffffeb0 = (undefined4)uStack_e0;
    in_stack_fffffffffffffeb4 = uStack_e0._4_4_;
    uVar9 = (undefined4)local_d8;
    uVar10 = local_d8._4_4_;
    uVar11 = (undefined4)uStack_d0;
    uVar12 = uStack_d0._4_4_;
    local_e8 = uVar1;
    uStack_e0 = uVar2;
    local_d8 = uVar3;
    uStack_d0 = uVar4;
    (*(local_50->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x1e])
              (local_b8,local_50,local_18);
    uVar6 = SimilarCatalogEntry::Found((SimilarCatalogEntry *)0x29b17f);
    if ((bool)uVar6) {
      bVar5 = ::std::
              vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
              empty((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                     *)CONCAT44(uVar12,uVar11));
      if ((bVar5) ||
         (pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                             ((vector<duckdb::SimilarCatalogEntry,_true> *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
         pvVar8->score <= local_98)) {
        bVar5 = ::std::
                vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
                empty((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                       *)CONCAT44(uVar12,uVar11));
        if ((!bVar5) &&
           (pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                               ((vector<duckdb::SimilarCatalogEntry,_true> *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
           pvVar8->score < local_98)) {
          vector<duckdb::SimilarCatalogEntry,_true>::clear
                    ((vector<duckdb::SimilarCatalogEntry,_true> *)0x29b261);
        }
        ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
        push_back((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                   *)CONCAT44(uVar12,uVar11),(value_type *)CONCAT44(uVar10,uVar9));
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::optional_ptr(&local_f8,local_50);
        pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::back
                           ((vector<duckdb::SimilarCatalogEntry,_true> *)
                            CONCAT17(uVar6,in_stack_fffffffffffffef0));
        (pvVar8->schema).ptr = local_f8.ptr;
      }
      local_ec = 0;
    }
    else {
      local_ec = 3;
    }
    SimilarCatalogEntry::~SimilarCatalogEntry((SimilarCatalogEntry *)0x29b2bd);
    ::std::__detail::
    _Node_const_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>::operator++
              ((_Node_const_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>
                *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  return in_RDI;
}

Assistant:

vector<SimilarCatalogEntry> Catalog::SimilarEntriesInSchemas(ClientContext &context, const EntryLookupInfo &lookup_info,
                                                             const reference_set_t<SchemaCatalogEntry> &schemas) {
	vector<SimilarCatalogEntry> results;
	for (auto schema_ref : schemas) {
		auto &schema = schema_ref.get();
		auto transaction = schema.catalog.GetCatalogTransaction(context);
		auto entry = schema.GetSimilarEntry(transaction, lookup_info);
		if (!entry.Found()) {
			// no similar entry found
			continue;
		}
		if (results.empty() || results[0].score <= entry.score) {
			if (!results.empty() && results[0].score < entry.score) {
				results.clear();
			}

			results.push_back(entry);
			results.back().schema = &schema;
		}
	}
	return results;
}